

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O1

void __thiscall
QHostInfoRunnable::QHostInfoRunnable
          (QHostInfoRunnable *this,QString *hn,int i,QObject *receiver,SlotObjUniquePtr slotObj)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  int *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->field_0x8 = 1;
  *(undefined ***)this = &PTR_run_002d0dc8;
  pDVar1 = (hn->d).d;
  (this->toBeLookedUp).d.d = pDVar1;
  (this->toBeLookedUp).d.ptr = (hn->d).ptr;
  (this->toBeLookedUp).d.size = (hn->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->id = i;
  local_20 = *(int **)slotObj._M_t.
                      super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                      .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
  *(undefined8 *)
   slotObj._M_t.
   super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
   super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
   super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl = 0;
  QHostInfoResult::QHostInfoResult(&this->resultEmitter,receiver,(SlotObjUniquePtr)&local_20);
  if (local_20 != (int *)0x0) {
    LOCK();
    *local_20 = *local_20 + -1;
    UNLOCK();
    if (*local_20 == 0) {
      (**(code **)(local_20 + 2))(0,local_20,0,0,0);
    }
  }
  local_20 = (int *)0x0;
  this->field_0x8 = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfoRunnable::QHostInfoRunnable(const QString &hn, int i, const QObject *receiver,
                                     QtPrivate::SlotObjUniquePtr slotObj)
    : toBeLookedUp{hn}, id{i}, resultEmitter{receiver, std::move(slotObj)}
{
    setAutoDelete(true);
}